

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O0

void p_bre(parse *p,int end1,int end2)

{
  long lVar1;
  bool bVar2;
  int local_28;
  int local_24;
  int wasdollar;
  int first;
  sopno start;
  int end2_local;
  int end1_local;
  parse *p_local;
  
  lVar1 = p->slen;
  local_24 = 1;
  local_28 = 0;
  if ((p->next < p->end) && (*p->next == '^')) {
    p->next = p->next + 1;
    doemit(p,0xc000000,0);
    p->g->iflags = p->g->iflags | 1;
    p->g->nbol = p->g->nbol + 1;
  }
  while( true ) {
    bVar2 = false;
    if (p->next < p->end) {
      bVar2 = false;
      if (((p->next < p->end) && (bVar2 = false, p->next + 1 < p->end)) &&
         (bVar2 = false, *p->next == end1)) {
        bVar2 = p->next[1] == end2;
      }
      bVar2 = (bool)(bVar2 ^ 1);
    }
    if (!bVar2) break;
    local_28 = p_simp_re(p,local_24);
    local_24 = 0;
  }
  if (local_28 != 0) {
    p->slen = p->slen + -1;
    doemit(p,0x10000000,0);
    p->g->iflags = p->g->iflags | 2;
    p->g->neol = p->g->neol + 1;
  }
  if (p->slen == lVar1) {
    seterr(p,0xe);
  }
  return;
}

Assistant:

static void
p_bre(p, end1, end2)
struct parse *p;
int end1;		/* first terminating character */
int end2;		/* second terminating character */
{
	sopno start = HERE();
	int first = 1;			/* first subexpression? */
	int wasdollar = 0;

	if (EAT('^')) {
		EMIT(OBOL, 0);
		p->g->iflags |= USEBOL;
		p->g->nbol++;
	}
	while (MORE() && !SEETWO(end1, end2)) {
		wasdollar = p_simp_re(p, first);
		first = 0;
	}
	if (wasdollar) {	/* oops, that was a trailing anchor */
		DROP(1);
		EMIT(OEOL, 0);
		p->g->iflags |= USEEOL;
		p->g->neol++;
	}

	REQUIRE(HERE() != start, REG_EMPTY);	/* require nonempty */
}